

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfCut.c
# Opt level: O1

void Cnf_CutDeref(Cnf_Man_t *p,Cnf_Cut_t *pCut)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  ulong uVar3;
  long lVar4;
  void *pvVar5;
  
  if ('\0' < pCut->nFanins) {
    lVar4 = 0;
    do {
      pVVar2 = p->pManAig->vObjs;
      if (pVVar2 == (Vec_Ptr_t *)0x0) {
        pvVar5 = (void *)0x0;
      }
      else {
        uVar1 = *(uint *)((long)pCut[1].vIsop + lVar4 * 4 + -8);
        if (((int)uVar1 < 0) || (pVVar2->nSize <= (int)uVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar5 = pVVar2->pArray[uVar1];
      }
      if (pvVar5 == (void *)0x0) {
        return;
      }
      uVar3 = *(ulong *)((long)pvVar5 + 0x18);
      if ((uVar3 & 0xffffffc0) == 0) {
        __assert_fail("pObj->nRefs > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfCut.c"
                      ,0x8d,"void Cnf_CutDeref(Cnf_Man_t *, Cnf_Cut_t *)");
      }
      *(ulong *)((long)pvVar5 + 0x18) =
           uVar3 & 0xffffffff0000003f | (ulong)((int)uVar3 - 0x40U & 0xffffffc0);
      lVar4 = lVar4 + 1;
    } while (lVar4 < pCut->nFanins);
  }
  return;
}

Assistant:

void Cnf_CutDeref( Cnf_Man_t * p, Cnf_Cut_t * pCut )
{
    Aig_Obj_t * pObj;
    int i;
    Cnf_CutForEachLeaf( p->pManAig, pCut, pObj, i )
    {
        assert( pObj->nRefs > 0 );
        pObj->nRefs--;
    }
}